

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createFree(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *pPVar1;
  PointerGraph *in_RSI;
  undefined8 in_RDI;
  PSNode *node;
  PSNode *op1;
  Value *in_stack_ffffffffffffffe0;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffe8;
  
  llvm::User::getOperand((User *)in_stack_ffffffffffffffe0,(uint)((ulong)in_RDI >> 0x20));
  pPVar1 = getOperand(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)16,dg::pta::PSNode*&>(in_RSI,(PSNode **)pPVar1)
  ;
  return pPVar1;
}

Assistant:

PSNode *LLVMPointerGraphBuilder::createFree(const llvm::Instruction *Inst) {
    PSNode *op1 = getOperand(Inst->getOperand(0));
    PSNode *node = PS.create<PSNodeType::FREE>(op1);

    return node;
}